

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O2

ssize_t __thiscall bsplib::Unbuf::send(Unbuf *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  ulong uVar2;
  exception *this_00;
  undefined4 in_register_00000034;
  ulong uVar3;
  Entry entry;
  undefined1 local_1b8 [16];
  size_t local_1a8;
  uint local_1a0;
  
  uVar3 = (long)(this->m_sends).
                super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_sends).
                super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                _M_impl.super__Vector_impl_data._M_start >> 5;
  uVar2 = 0x3fffffff - (long)this->m_pid;
  iVar1 = this->m_nprocs;
  if (uVar3 <= uVar2 / (ulong)(long)iVar1) {
    local_1a0 = ((int)uVar3 * iVar1 + this->m_pid) * 2;
    local_1b8._0_4_ = __fd;
    local_1b8._8_8_ = __buf;
    local_1a8 = __n;
    std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::push_back
              (&this->m_sends,(value_type *)local_1b8);
    return (ulong)local_1a0;
  }
  this_00 = (exception *)
            __cxa_allocate_exception
                      (0x1a0,CONCAT44(in_register_00000034,__fd),uVar2 % (ulong)(long)iVar1);
  exception::exception((exception *)local_1b8,"bsp_hpput");
  std::operator<<((ostream *)(local_1b8 + 8),"Too many HP messages");
  exception::exception(this_00,(exception *)local_1b8);
  __cxa_throw(this_00,&exception::typeinfo,exception::~exception);
}

Assistant:

int Unbuf :: send( int dst_pid, const void * addr, size_t size )
{
    size_t int_max = std::numeric_limits<int>::max();
    if ( m_sends.size() > (int_max/2 - m_pid)/m_nprocs )
        throw exception("bsp_hpput") << "Too many HP messages";

    Entry entry = { dst_pid, 
                    static_cast<char *>(const_cast<void*>(addr)),
                    size,
                    (int( m_sends.size() ) * m_nprocs + m_pid)*2
                  };
    m_sends.push_back( entry );
    return entry.tag;
}